

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

int arm_debug_target_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = env->features;
  if ((uVar1 >> 0x21 & 1) == 0) {
    bVar3 = false;
  }
  else {
    if (env->aarch64 == 0) {
      bVar3 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar3 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar3) {
      bVar3 = ((env->cp15).scr_el3 & 1) == 0;
    }
  }
  if (((((uVar1 >> 0x20 & 1) == 0) || (bVar3)) ||
      ((iVar2 = 2, ((env->cp15).hcr_el2 & 0x8000000) == 0 && (((env->cp15).mdcr_el2 & 0x100) == 0)))
      ) && (((uVar1 >> 0x21 & 1) == 0 ||
            (iVar2 = 3, !(bool)(((uint)uVar1 >> 0x1c & 1) == 0 & bVar3))))) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static inline int arm_debug_target_el(CPUARMState *env)
{
    bool secure = arm_is_secure(env);
    bool route_to_el2 = false;

    if (arm_feature(env, ARM_FEATURE_EL2) && !secure) {
        route_to_el2 = env->cp15.hcr_el2 & HCR_TGE ||
                       env->cp15.mdcr_el2 & MDCR_TDE;
    }

    if (route_to_el2) {
        return 2;
    } else if (arm_feature(env, ARM_FEATURE_EL3) &&
               !arm_el_is_aa64(env, 3) && secure) {
        return 3;
    } else {
        return 1;
    }
}